

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall
caffe::ContrastiveLossParameter::ContrastiveLossParameter
          (ContrastiveLossParameter *this,ContrastiveLossParameter *from)

{
  void *pvVar1;
  undefined3 uVar2;
  float fVar3;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__ContrastiveLossParameter_0071d0a0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  uVar2 = *(undefined3 *)&from->field_0x19;
  fVar3 = from->margin_;
  this->legacy_version_ = from->legacy_version_;
  *(undefined3 *)&this->field_0x19 = uVar2;
  this->margin_ = fVar3;
  return;
}

Assistant:

ContrastiveLossParameter::ContrastiveLossParameter(const ContrastiveLossParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&legacy_version_, &from.legacy_version_,
    reinterpret_cast<char*>(&margin_) -
    reinterpret_cast<char*>(&legacy_version_) + sizeof(margin_));
  // @@protoc_insertion_point(copy_constructor:caffe.ContrastiveLossParameter)
}